

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

void __thiscall ctemplate::TemplateDictionary::Dump(TemplateDictionary *this,int indent)

{
  string out;
  
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  (*(this->super_TemplateDictionaryInterface)._vptr_TemplateDictionaryInterface[4])
            (this,&out,indent);
  fwrite(out._M_dataplus._M_p,1,out._M_string_length,_stdout);
  fflush(_stdout);
  std::__cxx11::string::~string((string *)&out);
  return;
}

Assistant:

void TemplateDictionary::SetupGlobalDict()
    NO_THREAD_SAFETY_ANALYSIS {
  global_dict_ = new TemplateDictionary::GlobalDict;
  // Initialize the built-ins
  HashInsert(global_dict_, TemplateString("BI_SPACE"), TemplateString(" "));
  HashInsert(global_dict_, TemplateString("BI_NEWLINE"), TemplateString("\n"));
  // This is used for name-lookup misses.
  empty_string_ = new TemplateString("");
}